

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O1

void uss_fstat(SftpServer *srv,SftpReplyBuilder *reply,ptrlen handle)

{
  fxp_attrs fVar1;
  int iVar2;
  stat *__buf;
  stat st;
  stat local_98;
  
  iVar2 = uss_lookup_fd((UnixSftpServer *)(srv + -6),reply,handle);
  if (-1 < iVar2) {
    __buf = &local_98;
    iVar2 = fstat(iVar2,__buf);
    if (iVar2 < 0) {
      uss_error((UnixSftpServer *)reply,(SftpReplyBuilder *)__buf);
      return;
    }
    fVar1.size = local_98.st_size;
    fVar1.flags = 0xf;
    fVar1.uid._0_4_ = local_98.st_uid;
    fVar1.uid._4_4_ = 0;
    fVar1.gid._0_4_ = local_98.st_gid;
    fVar1.gid._4_4_ = 0;
    fVar1.permissions._0_4_ = local_98.st_mode;
    fVar1.permissions._4_4_ = 0;
    fVar1.atime = local_98.st_atim.tv_sec;
    fVar1.mtime = local_98.st_mtim.tv_sec;
    (*reply->vt->reply_attrs)(reply,fVar1);
  }
  return;
}

Assistant:

static void uss_fstat(SftpServer *srv, SftpReplyBuilder *reply,
                      ptrlen handle)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);
    struct stat st;
    int fd;

    if ((fd = uss_lookup_fd(uss, reply, handle)) < 0)
        return;
    int status = fstat(fd, &st);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        uss_reply_struct_stat(reply, &st);
    }
}